

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceTest_TestNonZeroIntMapEntriesHaveNoPresence_Test::
TestBody(NoFieldPresenceTest_TestNonZeroIntMapEntriesHaveNoPresence_Test *this)

{
  FieldDescriptor *field;
  Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *this_00;
  Message *x;
  pointer *__ptr;
  char *pcVar1;
  string_view name;
  Metadata MVar2;
  Metadata MVar3;
  AssertionResult gtest_ar;
  TestAllMapTypes message;
  Message local_118;
  AssertHelper local_110;
  undefined1 local_108 [8];
  UntypedMapBase *local_100;
  undefined1 local_e8 [216];
  
  proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes
            ((TestAllMapTypes *)local_e8,(Arena *)0x0);
  MVar2 = proto2_nofieldpresence_unittest::TestAllMapTypes::GetMetadata
                    ((TestAllMapTypes *)
                     proto2_nofieldpresence_unittest::_TestAllMapTypes_default_instance_);
  MVar3 = proto2_nofieldpresence_unittest::TestAllMapTypes::GetMetadata
                    ((TestAllMapTypes *)
                     proto2_nofieldpresence_unittest::_TestAllMapTypes_default_instance_);
  name._M_str = "map_int32_foreign_enum";
  name._M_len = 0x16;
  field = Descriptor::FindFieldByName(MVar3.descriptor,name);
  this_00 = protobuf::internal::
            TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>::MutableMap
                      ((TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum> *
                       )(local_e8 + 0x40));
  local_118.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 99;
  Map<int,proto2_nofieldpresence_unittest::ForeignEnum>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ForeignEnum>::iterator,_bool>
              *)local_108,this_00,(int *)&local_118);
  *(undefined4 *)(CONCAT71(local_108._1_7_,local_108[0]) + 0xc) = 2;
  x = Reflection::GetRepeatedMessage(MVar2.reflection,(Message *)local_e8,field,0);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::NotMatcher<google::protobuf::(anonymous_namespace)::MapEntryKeyExplicitPresenceMatcher>>
  ::operator()(local_108,"enum_map_entry",x);
  if (local_108[0] == '\0') {
    testing::Message::Message(&local_118);
    if (local_100 == (UntypedMapBase *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = *(char **)local_100;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x116,pcVar1);
    testing::internal::AssertHelper::operator=(&local_110,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)CONCAT44(local_118.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_118.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_118.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_118.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_100 != (UntypedMapBase *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::NotMatcher<google::protobuf::(anonymous_namespace)::MapEntryValueExplicitPresenceMatcher>>
  ::operator()(local_108,"enum_map_entry",x);
  if (local_108[0] == '\0') {
    testing::Message::Message(&local_118);
    if (local_100 == (UntypedMapBase *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = *(char **)local_100;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x119,pcVar1);
    testing::internal::AssertHelper::operator=(&local_110,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)CONCAT44(local_118.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_118.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_118.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_118.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_100 != (UntypedMapBase *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  }
  proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes((TestAllMapTypes *)local_e8);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, TestNonZeroIntMapEntriesHaveNoPresence) {
  TestAllMapTypes message;
  const Reflection* r = message.GetReflection();
  const Descriptor* desc = message.GetDescriptor();

  const FieldDescriptor* field_map_int32_foreign_enum =
      desc->FindFieldByName("map_int32_foreign_enum");

  // Set nonzero values for key-value pairs and test that.
  (*message.mutable_map_int32_foreign_enum())[99] = FOREIGN_BAZ;

  const google::protobuf::Message& enum_map_entry =
      r->GetRepeatedMessage(message, field_map_int32_foreign_enum, /*index=*/0);

  // Fields in map entries inherit field_presence from file defaults. If a map
  // is a "no presence" field, its key is also considered "no presence" from POV
  // of the descriptor. (Even though the key itself behaves like a normal index
  // with zeroes being valid indices). One day we will change this...
  EXPECT_THAT(enum_map_entry, Not(MapEntryKeyExplicitPresence()));

  // Primitive types inherit presence semantics from the map itself.
  EXPECT_THAT(enum_map_entry, Not(MapEntryValueExplicitPresence()));
}